

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_levels_dec_utils.c
# Opt level: O2

int WebPDequantizeLevels(uint8_t *data,int width,int height,int stride,int strength)

{
  long lVar1;
  void *pvVar2;
  byte bVar3;
  size_t __n;
  long lVar4;
  short sVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  void *ptr;
  long lVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  undefined2 *puVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  short *psVar20;
  int iVar21;
  uint8_t *puVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  short *psVar27;
  void *pvVar28;
  void *pvVar29;
  ulong uVar30;
  short sVar31;
  long lVar32;
  void *__s;
  long lVar33;
  ulong uVar34;
  uint8_t *local_190;
  char local_138 [264];
  
  iVar10 = 0;
  if (((uint)strength < 0x65) && ((0 < height && 0 < width) && data != (uint8_t *)0x0)) {
    uVar15 = (ulong)(width - 1U >> 1);
    if ((int)((long)strength / 0x19) * 2 < width) {
      uVar15 = (long)strength / 0x19 & 0xffffffff;
    }
    uVar18 = (ulong)(height - 1U >> 1);
    if ((int)uVar15 * 2 < height) {
      uVar18 = uVar15;
    }
    iVar16 = (int)uVar18;
    if (iVar16 < 1) {
      iVar10 = 1;
    }
    else {
      uVar15 = (ulong)(uint)((iVar16 * 2 + 2) * width * 2);
      uVar34 = (ulong)(uint)width;
      ptr = WebPSafeMalloc(1,uVar15 + uVar34 * 2 + 0xffe);
      iVar10 = 0;
      if (ptr != (void *)0x0) {
        iVar10 = -iVar16;
        __n = uVar34 * 2;
        uVar19 = iVar16 * 2 | 1;
        pvVar2 = (void *)((long)ptr + (ulong)(uVar19 * width) * 2);
        __s = (void *)((long)pvVar2 + uVar34 * -2);
        uVar17 = 0;
        memset(__s,0,__n);
        memset(local_138,0,0x100);
        lVar9 = (long)stride;
        uVar23 = 0xff;
        uVar11 = 0;
        uVar8 = 0xff;
        uVar7 = 0xff;
        uVar6 = 0;
        puVar22 = data;
        for (iVar24 = 0; iVar24 != height; iVar24 = iVar24 + 1) {
          for (uVar30 = 0; uVar34 != uVar30; uVar30 = uVar30 + 1) {
            bVar3 = puVar22[uVar30];
            uVar7 = (uint)bVar3;
            if (bVar3 < uVar8) {
              uVar23 = uVar7;
            }
            if (bVar3 <= uVar8) {
              uVar8 = uVar7;
            }
            if (uVar11 < uVar7) {
              uVar17 = (uint)bVar3;
            }
            if (uVar11 <= uVar7) {
              uVar11 = (uint)bVar3;
            }
            local_138[bVar3] = '\x01';
            uVar7 = uVar8;
            uVar6 = uVar11;
          }
          puVar22 = puVar22 + lVar9;
        }
        iVar24 = uVar6 - uVar7;
        uVar30 = 0xffffffffffffffff;
        iVar21 = 0;
        for (uVar12 = 0; uVar12 != 0x100; uVar12 = uVar12 + 1) {
          if (local_138[uVar12] != '\0') {
            iVar21 = iVar21 + 1;
            if (-1 < (int)uVar30) {
              iVar25 = (int)uVar12 - (int)uVar30;
              if (iVar25 < iVar24) {
                iVar24 = iVar25;
              }
            }
            uVar30 = uVar12 & 0xffffffff;
          }
        }
        puVar13 = (undefined2 *)((long)ptr + __n + uVar15 + 0x7fe);
        iVar26 = iVar24 * 0xc >> 2;
        psVar20 = (short *)((long)ptr + __n + uVar15 + 0x7fc);
        iVar25 = (iVar24 * 4 + -1) * iVar26;
        lVar33 = 0;
        while (lVar33 != 0x3ff) {
          lVar1 = lVar33 + 1;
          if (iVar26 < lVar1) {
            uVar8 = 0;
            if (lVar1 < iVar24 * 4) {
              uVar8 = iVar25 / (iVar24 * 4 - iVar26);
            }
          }
          else {
            uVar8 = (uint)lVar1;
          }
          sVar5 = (short)(uVar8 >> 2);
          *(short *)((long)ptr + lVar33 * 2 + __n + uVar15 + 0x800) = sVar5;
          *psVar20 = -sVar5;
          psVar20 = psVar20 + -1;
          iVar25 = iVar25 - iVar26;
          lVar33 = lVar1;
        }
        uVar8 = 0x40000 / (uVar19 * uVar19);
        *puVar13 = 0;
        if (2 < iVar21) {
          lVar33 = uVar18 + 1;
          uVar30 = (ulong)((iVar16 * 2 + 1U) * width);
          lVar1 = uVar30 * 2;
          psVar20 = (short *)(lVar1 + uVar18 * 2 + (long)ptr);
          lVar4 = uVar15 + uVar18 * 2 + 2;
          pvVar29 = ptr;
          local_190 = data;
          for (; pvVar28 = pvVar29, iVar10 != height; iVar10 = iVar10 + 1) {
            sVar5 = 0;
            for (uVar12 = 0; uVar34 != uVar12; uVar12 = uVar12 + 1) {
              sVar5 = sVar5 + (ushort)local_190[uVar12];
              sVar31 = *(short *)((long)__s + uVar12 * 2) + sVar5;
              *(short *)((long)ptr + uVar12 * 2 + uVar30 * 2) =
                   sVar31 - *(short *)((long)pvVar28 + uVar12 * 2);
              *(short *)((long)pvVar28 + uVar12 * 2) = sVar31;
            }
            pvVar29 = (void *)(uVar34 * 2 + (long)pvVar28);
            if (pvVar29 == pvVar2) {
              pvVar29 = ptr;
            }
            lVar32 = 0;
            if (iVar10 < (int)(height - 1U)) {
              lVar32 = lVar9;
            }
            if (iVar10 < 0) {
              lVar32 = 0;
            }
            if (iVar16 <= iVar10) {
              psVar27 = psVar20;
              for (lVar14 = 0; lVar33 != lVar14; lVar14 = lVar14 + 1) {
                *(short *)((long)ptr + lVar14 * 2 + uVar15) =
                     (short)((ushort)(*psVar27 + psVar20[lVar14 + -1]) * uVar8 >> 0x10);
                psVar27 = psVar27 + -1;
              }
              iVar24 = width * 2 + iVar16 * -2 + -3;
              for (lVar14 = 0; lVar33 + lVar14 < (long)(width - iVar16); lVar14 = lVar14 + 1) {
                *(short *)((long)ptr + lVar14 * 2 + lVar4) =
                     (short)((ushort)(*(short *)((long)ptr + lVar14 * 2 + lVar1 + uVar18 * 4 + 2) -
                                     *(short *)((long)pvVar2 + (long)(int)lVar14 * 2)) * uVar8 >>
                            0x10);
                iVar24 = iVar24 + -1;
              }
              for (; (ulong)(lVar33 + lVar14) < uVar34; lVar14 = lVar14 + 1) {
                *(short *)((long)ptr + lVar14 * 2 + lVar4) =
                     (short)(((uint)*(ushort *)((long)pvVar2 + uVar34 * 2 + -2) * 2 -
                              (uint)(ushort)(*(short *)((long)pvVar2 + (long)iVar24 * 2) +
                                            *(short *)((long)pvVar2 + (long)(int)lVar14 * 2)) &
                             0xffff) * uVar8 >> 0x10);
                iVar24 = iVar24 + -1;
              }
              for (uVar12 = 0; uVar34 != uVar12; uVar12 = uVar12 + 1) {
                bVar3 = data[uVar12];
                if ((bVar3 < uVar17) && (uVar23 < bVar3)) {
                  iVar24 = (int)(short)puVar13[(ulong)*(ushort *)((long)ptr + uVar12 * 2 + uVar15) -
                                               (ulong)((uint)bVar3 * 4)] + (uint)bVar3;
                  if (iVar24 < 1) {
                    iVar24 = 0;
                  }
                  if (0xfe < iVar24) {
                    iVar24 = 0xff;
                  }
                  data[uVar12] = (uint8_t)iVar24;
                }
              }
              data = data + lVar9;
            }
            local_190 = local_190 + lVar32;
            __s = pvVar28;
          }
        }
        WebPSafeFree(ptr);
        iVar10 = 1;
      }
    }
  }
  return iVar10;
}

Assistant:

int WebPDequantizeLevels(uint8_t* const data, int width, int height, int stride,
                         int strength) {
  int radius = 4 * strength / 100;

  if (strength < 0 || strength > 100) return 0;
  if (data == NULL || width <= 0 || height <= 0) return 0;  // bad params

  // limit the filter size to not exceed the image dimensions
  if (2 * radius + 1 > width) radius = (width - 1) >> 1;
  if (2 * radius + 1 > height) radius = (height - 1) >> 1;

  if (radius > 0) {
    SmoothParams p;
    memset(&p, 0, sizeof(p));
    if (!InitParams(data, width, height, stride, radius, &p)) return 0;
    if (p.num_levels > 2) {
      for (; p.row < p.height; ++p.row) {
        VFilter(&p);  // accumulate average of input
        // Need to wait few rows in order to prime the filter,
        // before emitting some output.
        if (p.row >= p.radius) {
          HFilter(&p);
          ApplyFilter(&p);
        }
      }
    }
    CleanupParams(&p);
  }
  return 1;
}